

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int ZSTDMT_serialState_reset
              (serialState_t *serialState,ZSTDMT_seqPool *seqPool,ZSTD_CCtx_params params,
              size_t jobSize,void *dict,size_t dictSize)

{
  U32 UVar1;
  U32 UVar2;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  U32 UVar3;
  ZSTD_allocFunction p_Var4;
  ZSTD_freeFunction p_Var5;
  void *pvVar6;
  U64 UVar7;
  size_t __size;
  size_t __size_00;
  ldmEntry_t *ptr;
  BYTE *pBVar8;
  U32 UVar9;
  U32 UVar10;
  ulong uVar11;
  
  if (params.ldmParams.enableLdm == 0) {
    params.ldmParams.hashRateLog = 0;
    params.ldmParams.windowLog = 0;
    params.ldmParams.enableLdm = 0;
    params.ldmParams.hashLog = 0;
    params.ldmParams.bucketSizeLog = 0;
    params.ldmParams.minMatchLength = 0;
    uVar11 = 0;
    UVar10 = 0;
    UVar9 = 0;
  }
  else {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    UVar10 = params.ldmParams.bucketSizeLog;
    UVar9 = params.ldmParams.hashLog;
    if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4c36,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t)"
                   );
    }
    if (0x1f < params.ldmParams.hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4c37,
                    "int ZSTDMT_serialState_reset(serialState_t *, ZSTDMT_seqPool *, ZSTD_CCtx_params, size_t, const void *, const size_t)"
                   );
    }
    uVar11 = (ulong)params.ldmParams.minMatchLength;
    UVar7 = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    (serialState->ldmState).hashPower = UVar7;
  }
  pvVar6 = params.customMem.opaque;
  p_Var5 = params.customMem.customFree;
  p_Var4 = params.customMem.customAlloc;
  serialState->nextJobID = 0;
  if (params.fParams.checksumFlag != 0) {
    (serialState->xxhState).total_len = 0;
    (serialState->xxhState).v1 = 0x60ea27eeadc0b5d6;
    (serialState->xxhState).v2 = 0xc2b2ae3d27d4eb4f;
    (serialState->xxhState).v3 = 0;
    (serialState->xxhState).v4 = 0x61c8864e7a143579;
    (serialState->xxhState).mem64[0] = 0;
    (serialState->xxhState).mem64[1] = 0;
    (serialState->xxhState).mem64[2] = 0;
    (serialState->xxhState).mem64[3] = 0;
    (serialState->xxhState).memsize = 0;
    (serialState->xxhState).reserved[0] = 0;
  }
  if (params.ldmParams.enableLdm != 0) {
    __size = 8L << ((byte)UVar9 & 0x3f);
    __size_00 = 1L << ((byte)(UVar9 - UVar10) & 0x3f);
    UVar1 = (serialState->params).ldmParams.hashLog;
    UVar2 = (serialState->params).ldmParams.bucketSizeLog;
    ZSTDMT_setBufferSize(seqPool,(jobSize / uVar11) * 0xc);
    (serialState->ldmState).window.base = "";
    (serialState->ldmState).window.dictBase = "";
    (serialState->ldmState).window.dictLimit = 1;
    (serialState->ldmState).window.lowLimit = 1;
    (serialState->ldmState).window.nextSrc = (BYTE *)"File %s";
    (serialState->ldmWindow).nextSrc = (serialState->ldmState).window.nextSrc;
    (serialState->ldmWindow).base = (serialState->ldmState).window.base;
    (serialState->ldmWindow).dictBase = (serialState->ldmState).window.dictBase;
    UVar3 = (serialState->ldmState).window.lowLimit;
    (serialState->ldmWindow).dictLimit = (serialState->ldmState).window.dictLimit;
    (serialState->ldmWindow).lowLimit = UVar3;
    ptr = (serialState->ldmState).hashTable;
    if ((ptr == (ldmEntry_t *)0x0) || ((serialState->params).ldmParams.hashLog < UVar9)) {
      customMem.customFree = p_Var5;
      customMem.customAlloc = p_Var4;
      customMem.opaque = pvVar6;
      ZSTD_free(ptr,customMem);
      if (p_Var4 == (ZSTD_allocFunction)0x0) {
        ptr = (ldmEntry_t *)malloc(__size);
      }
      else {
        ptr = (ldmEntry_t *)(*p_Var4)(pvVar6,__size);
      }
      (serialState->ldmState).hashTable = ptr;
    }
    pBVar8 = (serialState->ldmState).bucketOffsets;
    if ((pBVar8 == (BYTE *)0x0) || (UVar1 - UVar2 < UVar9 - UVar10)) {
      customMem_00.customFree = p_Var5;
      customMem_00.customAlloc = p_Var4;
      customMem_00.opaque = pvVar6;
      ZSTD_free(pBVar8,customMem_00);
      if (p_Var4 == (ZSTD_allocFunction)0x0) {
        pBVar8 = (BYTE *)malloc(__size_00);
      }
      else {
        pBVar8 = (BYTE *)(*p_Var4)(pvVar6,__size_00);
      }
      (serialState->ldmState).bucketOffsets = pBVar8;
      ptr = (serialState->ldmState).hashTable;
      if (ptr == (ldmEntry_t *)0x0) {
        return 1;
      }
      if (pBVar8 == (BYTE *)0x0) {
        return 1;
      }
    }
    else if (ptr == (ldmEntry_t *)0x0) {
      return 1;
    }
    memset(ptr,0,__size);
    memset((serialState->ldmState).bucketOffsets,0,__size_00);
    if (dict != (void *)0x0) {
      ZSTD_window_update(&(serialState->ldmState).window,dict,dictSize);
      ZSTD_ldm_fillHashTable
                (&serialState->ldmState,(BYTE *)dict,(BYTE *)(dictSize + (long)dict),
                 &params.ldmParams);
    }
  }
  memcpy(&serialState->params,&params,0x90);
  (serialState->params).jobSize = jobSize & 0xffffffff;
  return 0;
}

Assistant:

static int ZSTDMT_serialState_reset(serialState_t* serialState,
                        ZSTDMT_seqPool* seqPool, ZSTD_CCtx_params params,
                        size_t jobSize, const void* dict, size_t const dictSize)
{
    /* Adjust parameters */
    if (params.ldmParams.enableLdm) {
        DEBUGLOG(4, "LDM window size = %u KB", (1U << params.cParams.windowLog) >> 10);
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        serialState->ldmState.hashPower =
                ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    } else {
        memset(&params.ldmParams, 0, sizeof(params.ldmParams));
    }
    serialState->nextJobID = 0;
    if (params.fParams.checksumFlag)
        XXH64_reset(&serialState->xxhState, 0);
    if (params.ldmParams.enableLdm) {
        ZSTD_customMem cMem = params.customMem;
        unsigned const hashLog = params.ldmParams.hashLog;
        size_t const hashSize = ((size_t)1 << hashLog) * sizeof(ldmEntry_t);
        unsigned const bucketLog =
            params.ldmParams.hashLog - params.ldmParams.bucketSizeLog;
        size_t const bucketSize = (size_t)1 << bucketLog;
        unsigned const prevBucketLog =
            serialState->params.ldmParams.hashLog -
            serialState->params.ldmParams.bucketSizeLog;
        /* Size the seq pool tables */
        ZSTDMT_setNbSeq(seqPool, ZSTD_ldm_getMaxNbSeq(params.ldmParams, jobSize));
        /* Reset the window */
        ZSTD_window_init(&serialState->ldmState.window);
        serialState->ldmWindow = serialState->ldmState.window;
        /* Resize tables and output space if necessary. */
        if (serialState->ldmState.hashTable == NULL || serialState->params.ldmParams.hashLog < hashLog) {
            ZSTD_free(serialState->ldmState.hashTable, cMem);
            serialState->ldmState.hashTable = (ldmEntry_t*)ZSTD_malloc(hashSize, cMem);
        }
        if (serialState->ldmState.bucketOffsets == NULL || prevBucketLog < bucketLog) {
            ZSTD_free(serialState->ldmState.bucketOffsets, cMem);
            serialState->ldmState.bucketOffsets = (BYTE*)ZSTD_malloc(bucketSize, cMem);
        }
        if (!serialState->ldmState.hashTable || !serialState->ldmState.bucketOffsets)
            return 1;
        /* Zero the tables */
        memset(serialState->ldmState.hashTable, 0, hashSize);
        memset(serialState->ldmState.bucketOffsets, 0, bucketSize);
    }

    /* Update window state and fill hash table with dict */
    if (params.ldmParams.enableLdm && dict) {
        ZSTD_window_update(&serialState->ldmState.window, dict, dictSize);
        ZSTD_ldm_fillHashTable(&serialState->ldmState, (const BYTE*)dict, (const BYTE*)dict + dictSize, &params.ldmParams);
    }

    serialState->params = params;
    serialState->params.jobSize = (U32)jobSize;
    return 0;
}